

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O0

void __thiscall
PacketProcessor::packForeach
          (PacketProcessor *this,void *data,uint32_t size,
          function<void_(unsigned_char_*,_unsigned_long)> *handle)

{
  uint16_t uVar1;
  uint16_t local_44;
  uint16_t crcSum;
  uint16_t sizeCrc;
  uint32_t dataSize;
  uint8_t tmp [4];
  function<void_(unsigned_char_*,_unsigned_long)> *handle_local;
  uint32_t size_local;
  void *data_local;
  PacketProcessor *this_local;
  
  crcSum._0_1_ = 0x5a;
  crcSum._1_1_ = 0xa5;
  _dataSize = handle;
  std::function<void_(unsigned_char_*,_unsigned_long)>::operator()(handle,(uchar *)&crcSum,2);
  crcSum._0_1_ = (undefined1)(size >> 0x18);
  crcSum._1_1_ = (undefined1)(size >> 0x10);
  sizeCrc._0_1_ = (undefined1)(size >> 8);
  sizeCrc._1_1_ = (undefined1)size;
  std::function<void_(unsigned_char_*,_unsigned_long)>::operator()(_dataSize,(uchar *)&crcSum,4);
  uVar1 = crc_16((uchar *)&crcSum,4);
  crcSum._0_1_ = (undefined1)(uVar1 >> 8);
  crcSum._1_1_ = (undefined1)uVar1;
  std::function<void_(unsigned_char_*,_unsigned_long)>::operator()(_dataSize,(uchar *)&crcSum,2);
  std::function<void_(unsigned_char_*,_unsigned_long)>::operator()
            (_dataSize,(uchar *)data,(ulong)size);
  if ((this->useCrc_ & 1U) == 0) {
    local_44 = calCrc<unsigned_int>(size);
    local_44 = local_44 ^ 0xffff;
  }
  else {
    local_44 = crc_16((uchar *)data,(ulong)size);
  }
  crcSum._0_1_ = (undefined1)(local_44 >> 8);
  crcSum._1_1_ = (undefined1)local_44;
  std::function<void_(unsigned_char_*,_unsigned_long)>::operator()(_dataSize,(uchar *)&crcSum,2);
  return;
}

Assistant:

void PacketProcessor::packForeach(const void* data, uint32_t size, const std::function<void(uint8_t* data, size_t size)>& handle) const {
  uint8_t tmp[4];

  tmp[0] = H_1;
  tmp[1] = H_2;
  handle(tmp, 2);

  uint32_t dataSize = size;
  tmp[0] = (dataSize & 0xff000000) >> 8 * 3;
  tmp[1] = (dataSize & 0x00ff0000) >> 8 * 2;
  tmp[2] = (dataSize & 0x0000ff00) >> 8 * 1;
  tmp[3] = (dataSize & 0x000000ff) >> 8 * 0;
  handle(tmp, 4);

  uint16_t sizeCrc = crc_16(tmp, 4);
  tmp[0] = (sizeCrc & 0xff00) >> 8 * 1;
  tmp[1] = (sizeCrc & 0x00ff) >> 8 * 0;
  handle(tmp, 2);

  handle((uint8_t*)data, size);

  uint16_t crcSum = useCrc_ ? crc_16((uint8_t*)data, size) : ~calCrc(size);
  tmp[0] = (crcSum & 0xff00) >> 8 * 1;
  tmp[1] = (crcSum & 0x00ff) >> 8 * 0;
  handle(tmp, 2);
}